

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::encoder_strategy>
::do_line(jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::encoder_strategy>
          *this,quad<unsigned_short> *param_1)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  pixel_type *ppVar13;
  pixel_type *ppVar14;
  uint uVar15;
  sample_type sVar16;
  sample_type sVar17;
  sample_type sVar18;
  sample_type sVar19;
  int32_t iVar20;
  int32_t iVar21;
  int32_t iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int qs;
  int qs_00;
  uint predicted;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  int qs_01;
  uint index;
  uint uVar32;
  int qs_02;
  uint uVar33;
  uint uVar34;
  
  if (this->width_ != 0) {
    index = 0;
    do {
      ppVar13 = this->previous_line_;
      ppVar14 = this->current_line_;
      uVar1 = ppVar14[(long)(int)index + -1].super_triplet<unsigned_short>.field_0.v1;
      uVar28 = (uint)uVar1;
      uVar2 = ppVar14[(long)(int)index + -1].super_triplet<unsigned_short>.field_1.v2;
      uVar29 = (uint)uVar2;
      uVar3 = ppVar14[(long)(int)index + -1].super_triplet<unsigned_short>.field_2.v3;
      uVar30 = (uint)uVar3;
      uVar4 = ppVar14[(long)(int)index + -1].field_0.v4;
      uVar33 = (uint)uVar4;
      uVar5 = ppVar13[(long)(int)index + -1].super_triplet<unsigned_short>.field_0.v1;
      uVar23 = (uint)ppVar13[(long)(int)index + -1].super_triplet<unsigned_short>.field_1.v2;
      uVar24 = (uint)ppVar13[(long)(int)index + -1].super_triplet<unsigned_short>.field_2.v3;
      uVar25 = (uint)ppVar13[(long)(int)index + -1].field_0.v4;
      uVar6 = ppVar13[(int)index].super_triplet<unsigned_short>.field_0.v1;
      uVar7 = ppVar13[(int)index].super_triplet<unsigned_short>.field_1.v2;
      uVar8 = ppVar13[(int)index].super_triplet<unsigned_short>.field_2.v3;
      uVar26 = (uint)uVar8;
      uVar9 = ppVar13[(int)index].field_0.v4;
      uVar27 = (uint)uVar9;
      uVar10 = ppVar13[(long)(int)index + 1].super_triplet<unsigned_short>.field_1.v2;
      uVar11 = ppVar13[(long)(int)index + 1].super_triplet<unsigned_short>.field_2.v3;
      uVar12 = ppVar13[(long)(int)index + 1].field_0.v4;
      uVar32 = (uint)uVar6;
      iVar20 = quantize_gradient(this,ppVar13[(long)(int)index + 1].super_triplet<unsigned_short>.
                                      field_0.v1 - uVar32);
      uVar31 = (uint)uVar6 - (uint)uVar5;
      iVar21 = quantize_gradient(this,uVar31);
      iVar22 = quantize_gradient(this,uVar5 - uVar28);
      qs = (iVar20 * 9 + iVar21) * 9 + iVar22;
      uVar34 = (uint)uVar7;
      iVar20 = quantize_gradient(this,uVar10 - uVar34);
      iVar21 = quantize_gradient(this,uVar7 - uVar23);
      iVar22 = quantize_gradient(this,uVar23 - uVar29);
      qs_00 = (iVar20 * 9 + iVar21) * 9 + iVar22;
      iVar20 = quantize_gradient(this,uVar11 - uVar26);
      iVar21 = quantize_gradient(this,uVar26 - uVar24);
      iVar22 = quantize_gradient(this,uVar24 - uVar30);
      qs_02 = (iVar20 * 9 + iVar21) * 9 + iVar22;
      iVar20 = quantize_gradient(this,uVar12 - uVar27);
      iVar21 = quantize_gradient(this,uVar27 - uVar25);
      iVar22 = quantize_gradient(this,uVar25 - uVar33);
      qs_01 = (iVar20 * 9 + iVar21) * 9 + iVar22;
      if (((qs_00 == 0 && qs == 0) && qs_02 == 0) && qs_01 == 0) {
        iVar20 = do_run_mode(this,index,(encoder_strategy *)0x0);
        uVar33 = index + iVar20;
      }
      else {
        uVar15 = -(uint)(uVar6 < uVar1);
        predicted = uVar32;
        if ((-1 < (int)(uVar5 - uVar28 ^ uVar15)) &&
           (predicted = uVar28, -1 < (int)(uVar31 ^ uVar15))) {
          predicted = uVar32 + (uVar28 - uVar5);
        }
        sVar16 = do_regular(this,qs,(uint)this->current_line_[(int)index].
                                          super_triplet<unsigned_short>.field_0.v1,predicted,
                            (encoder_strategy *)0x0);
        uVar28 = -(uint)(uVar7 < uVar2);
        uVar31 = uVar34;
        if ((-1 < (int)(uVar23 - uVar29 ^ uVar28)) &&
           (uVar31 = uVar29, -1 < (int)(uVar7 - uVar23 ^ uVar28))) {
          uVar31 = uVar34 + (uVar29 - uVar23);
        }
        sVar17 = do_regular(this,qs_00,
                            (uint)this->current_line_[(int)index].super_triplet<unsigned_short>.
                                  field_1.v2,uVar31,(encoder_strategy *)0x0);
        uVar23 = -(uint)(uVar8 < uVar3);
        uVar28 = uVar26;
        if ((-1 < (int)(uVar24 - uVar30 ^ uVar23)) &&
           (uVar28 = uVar30, -1 < (int)(uVar26 - uVar24 ^ uVar23))) {
          uVar28 = uVar26 + (uVar30 - uVar24);
        }
        sVar18 = do_regular(this,qs_02,
                            (uint)this->current_line_[(int)index].super_triplet<unsigned_short>.
                                  field_2.v3,uVar28,(encoder_strategy *)0x0);
        uVar23 = -(uint)(uVar9 < uVar4);
        uVar24 = uVar27;
        if ((-1 < (int)(uVar25 - uVar33 ^ uVar23)) &&
           (uVar24 = uVar33, -1 < (int)(uVar27 - uVar25 ^ uVar23))) {
          uVar24 = uVar27 + (uVar33 - uVar25);
        }
        uVar33 = index + 1;
        sVar19 = do_regular(this,qs_01,(uint)this->current_line_[(int)index].field_0.v4,uVar24,
                            (encoder_strategy *)0x0);
        this->current_line_[(int)index] =
             (pixel_type)
             ((ulong)sVar16 | (ulong)sVar17 << 0x10 | (ulong)sVar18 << 0x20 | (ulong)sVar19 << 0x30)
        ;
      }
      index = uVar33;
    } while (uVar33 < this->width_);
  }
  return;
}

Assistant:

void do_line(quad<sample_type>* /*template_selector*/)
    {
        int32_t index{};
        while (static_cast<uint32_t>(index) < width_)
        {
            const quad<sample_type> ra{current_line_[index - 1]};
            const quad<sample_type> rc{previous_line_[index - 1]};
            const quad<sample_type> rb{previous_line_[index]};
            const quad<sample_type> rd{previous_line_[index + 1]};

            const int32_t qs1{compute_context_id(quantize_gradient(rd.v1 - rb.v1), quantize_gradient(rb.v1 - rc.v1),
                                                 quantize_gradient(rc.v1 - ra.v1))};
            const int32_t qs2{compute_context_id(quantize_gradient(rd.v2 - rb.v2), quantize_gradient(rb.v2 - rc.v2),
                                                 quantize_gradient(rc.v2 - ra.v2))};
            const int32_t qs3{compute_context_id(quantize_gradient(rd.v3 - rb.v3), quantize_gradient(rb.v3 - rc.v3),
                                                 quantize_gradient(rc.v3 - ra.v3))};
            const int32_t qs4{compute_context_id(quantize_gradient(rd.v4 - rb.v4), quantize_gradient(rb.v4 - rc.v4),
                                                 quantize_gradient(rc.v4 - ra.v4))};

            if (qs1 == 0 && qs2 == 0 && qs3 == 0 && qs4 == 0)
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
            }
            else
            {
                quad<sample_type> rx;
                rx.v1 = do_regular(qs1, current_line_[index].v1, get_predicted_value(ra.v1, rb.v1, rc.v1),
                                   static_cast<Strategy*>(nullptr));
                rx.v2 = do_regular(qs2, current_line_[index].v2, get_predicted_value(ra.v2, rb.v2, rc.v2),
                                   static_cast<Strategy*>(nullptr));
                rx.v3 = do_regular(qs3, current_line_[index].v3, get_predicted_value(ra.v3, rb.v3, rc.v3),
                                   static_cast<Strategy*>(nullptr));
                rx.v4 = do_regular(qs4, current_line_[index].v4, get_predicted_value(ra.v4, rb.v4, rc.v4),
                                   static_cast<Strategy*>(nullptr));
                current_line_[index] = rx;
                ++index;
            }
        }
    }